

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utest.cpp
# Opt level: O0

void __thiscall
UtestShell::assertCstrNEqual
          (UtestShell *this,char *expected,char *actual,size_t length,char *text,char *fileName,
          size_t lineNumber,TestTerminator *testTerminator)

{
  int iVar1;
  TestResult *pTVar2;
  size_t in_RCX;
  char *in_RDX;
  char *in_RSI;
  long *in_RDI;
  undefined8 in_stack_00000010;
  UtestShell *in_stack_fffffffffffffe68;
  UtestShell *otherBuffer;
  SimpleString *in_stack_fffffffffffffe70;
  undefined1 local_120 [8];
  char *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  UtestShell *in_stack_ffffffffffffff08;
  StringEqualFailure *in_stack_ffffffffffffff10;
  SimpleString *in_stack_ffffffffffffff20;
  UtestShell local_a8 [2];
  size_t local_20;
  char *local_18;
  char *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pTVar2 = getTestResult(in_stack_fffffffffffffe68);
  (*pTVar2->_vptr_TestResult[10])();
  if ((local_18 != (char *)0x0) || (local_10 != (char *)0x0)) {
    if ((local_18 == (char *)0x0) ||
       (otherBuffer = in_stack_fffffffffffffe68, local_10 == (char *)0x0)) {
      otherBuffer = local_a8;
      SimpleString::SimpleString(in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68);
      StringEqualFailure::StringEqualFailure
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 in_stack_ffffffffffffff20);
      (**(code **)(*in_RDI + 0x138))(in_RDI,&local_a8[0].name_,in_stack_00000010);
      StringEqualFailure::~StringEqualFailure((StringEqualFailure *)0x186f28);
      SimpleString::~SimpleString((SimpleString *)0x186f35);
    }
    iVar1 = SimpleString::StrNCmp(local_10,local_18,local_20);
    if (iVar1 != 0) {
      SimpleString::SimpleString(in_stack_fffffffffffffe70,(char *)otherBuffer);
      StringEqualFailure::StringEqualFailure
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 in_stack_ffffffffffffff20);
      (**(code **)(*in_RDI + 0x138))(in_RDI,local_120,in_stack_00000010);
      StringEqualFailure::~StringEqualFailure((StringEqualFailure *)0x18704b);
      SimpleString::~SimpleString((SimpleString *)0x187055);
    }
  }
  return;
}

Assistant:

void UtestShell::assertCstrNEqual(const char* expected, const char* actual, size_t length, const char* text, const char* fileName, size_t lineNumber, const TestTerminator& testTerminator)
{
    getTestResult()->countCheck();
    if (actual == NULLPTR && expected == NULLPTR) return;
    if (actual == NULLPTR || expected == NULLPTR)
        failWith(StringEqualFailure(this, fileName, lineNumber, expected, actual, text), testTerminator);
    if (SimpleString::StrNCmp(expected, actual, length) != 0)
        failWith(StringEqualFailure(this, fileName, lineNumber, expected, actual, text), testTerminator);
}